

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Group_Type.cxx
# Opt level: O2

void ungroup_cb(Fl_Widget *param_1,void *param_2)

{
  uint uVar1;
  Fl_Type *pFVar2;
  int iVar3;
  undefined4 extraout_var;
  Fl_Type *pFVar4;
  Fl_Type **ppFVar5;
  char *pcVar6;
  undefined4 extraout_var_00;
  
  ppFVar5 = &Fl_Type::current;
  pcVar6 = (char *)param_2;
  while (pFVar2 = *ppFVar5, pFVar2 != (Fl_Type *)0x0) {
    iVar3 = (*pFVar2->_vptr_Fl_Type[0x17])(pFVar2);
    if (iVar3 != 0) {
      iVar3 = (*pFVar2->_vptr_Fl_Type[0x1e])(pFVar2);
      if (iVar3 == 0) {
        pFVar2 = pFVar2->parent;
        if ((pFVar2 == (Fl_Type *)0x0) || (pFVar2->level < 1)) break;
        if (pFVar2->level == 1) {
          iVar3 = (*pFVar2->_vptr_Fl_Type[5])(pFVar2);
          pcVar6 = "widget_class";
          iVar3 = strcmp((char *)CONCAT44(extraout_var,iVar3),"widget_class");
          if (iVar3 == 0) break;
        }
        ppFVar5 = &pFVar2->next;
        goto LAB_0017e1d7;
      }
    }
    ppFVar5 = &pFVar2->parent;
  }
  pcVar6 = "Please select widgets in a group";
LAB_0017e202:
  fl_message(pcVar6);
  return;
LAB_0017e1d7:
  pFVar4 = *ppFVar5;
  if (pFVar4 == (Fl_Type *)0x0) {
LAB_0017e20e:
    pFVar4 = pFVar2->next;
    while ((pFVar4 != (Fl_Type *)0x0 && (pFVar2->level < pFVar4->level))) {
      iVar3 = Fl_Type::remove(pFVar4,pcVar6);
      pcVar6 = (char *)pFVar2;
      Fl_Type::insert(pFVar4,pFVar2);
      pFVar4 = (Fl_Type *)CONCAT44(extraout_var_00,iVar3);
    }
    (*pFVar2->_vptr_Fl_Type[2])(pFVar2);
    return;
  }
  uVar1 = pFVar2->level;
  pcVar6 = (char *)(ulong)uVar1;
  if (pFVar4->level <= (int)uVar1) goto LAB_0017e20e;
  pcVar6 = (char *)(ulong)(uVar1 + 1);
  if ((pFVar4->level == uVar1 + 1) && (pFVar4->selected == '\0')) {
    pcVar6 = "Please select all widgets in group";
    goto LAB_0017e202;
  }
  ppFVar5 = &pFVar4->next;
  goto LAB_0017e1d7;
}

Assistant:

void ungroup_cb(Fl_Widget *, void *) {
  // Find the group:
  Fl_Type *q = Fl_Type::current;
  while (q && (!q->is_widget() || q->is_menu_item())) q = q->parent;
  if (q) q = q->parent;
  if (!q || q->level < 1 || (q->level == 1 && !strcmp(q->type_name(), "widget_class"))) {
    fl_message("Please select widgets in a group");
    return;
  }
  Fl_Type* n;
  for (n = q->next; n && n->level > q->level; n = n->next) {
    if (n->level == q->level+1 && !n->selected) {
      fl_message("Please select all widgets in group");
      return;
    }
  }
  for (n = q->next; n && n->level > q->level;) {
    Fl_Type *nxt = n->remove();
    n->insert(q);
    n = nxt;
  }
  delete q;
}